

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockwise.c
# Opt level: O3

void cf_blockwise_acc_byte
               (uint8_t *partial,size_t *npartial,size_t nblock,uint8_t byte,size_t nbytes,
               cf_blockwise_in_fn process,void *ctx)

{
  bool bVar1;
  size_t sVar2;
  size_t __x;
  ulong __n;
  
  if (nbytes != 0) {
    sVar2 = *npartial;
    bVar1 = false;
    do {
      __n = nblock - sVar2;
      if (nbytes < nblock - sVar2) {
        __n = nbytes;
      }
      if (!bVar1) {
        memset(partial + sVar2,(uint)byte,__n);
      }
      if (__n == nblock && sVar2 == 0) {
        bVar1 = true;
      }
      if (sVar2 + __n == nblock) {
        (*process)(ctx,partial);
        sVar2 = 0;
      }
      else {
        sVar2 = *npartial + __n;
      }
      *npartial = sVar2;
      nbytes = nbytes - __n;
    } while (nbytes != 0);
  }
  return;
}

Assistant:

void cf_blockwise_acc_byte(uint8_t *partial, size_t *npartial,
                           size_t nblock,
                           uint8_t byte, size_t nbytes,
                           cf_blockwise_in_fn process,
                           void *ctx)
{
  /* only memset the whole of the block once */
  int filled = 0;

  while (nbytes)
  {
    size_t start = *npartial;
    size_t count = MIN(nbytes, nblock - start);

    if (!filled)
      memset(partial + start, byte, count);

    if (start == 0 && count == nblock)
      filled = 1;

    if (start + count == nblock)
    {
      process(ctx, partial);
      *npartial = 0;
    } else {
      *npartial += count;
    }

    nbytes -= count;
  }
}